

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

int CertVerifyCallback(X509_STORE_CTX *store_ctx,void *arg)

{
  bool bVar1;
  int iVar2;
  SSL *ssl;
  void *pvVar3;
  TestState *pTVar4;
  
  iVar2 = SSL_get_ex_data_X509_STORE_CTX_idx();
  ssl = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)store_ctx,iVar2);
  iVar2 = TestConfigExDataIndex();
  pvVar3 = SSL_get_ex_data(ssl,iVar2);
  bVar1 = CheckVerifyCallback((SSL *)ssl);
  iVar2 = 0;
  if (bVar1) {
    pTVar4 = GetTestState((SSL *)ssl);
    pTVar4->cert_verified = true;
    iVar2 = 1;
    if (*(char *)((long)pvVar3 + 0x532) == '\x01') {
      X509_STORE_CTX_set_error((X509_STORE_CTX *)store_ctx,0x32);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int CertVerifyCallback(X509_STORE_CTX *store_ctx, void *arg) {
  SSL *ssl = (SSL *)X509_STORE_CTX_get_ex_data(
      store_ctx, SSL_get_ex_data_X509_STORE_CTX_idx());
  const TestConfig *config = GetTestConfig(ssl);
  if (!CheckVerifyCallback(ssl)) {
    return 0;
  }

  GetTestState(ssl)->cert_verified = true;
  if (config->verify_fail) {
    X509_STORE_CTX_set_error(store_ctx, X509_V_ERR_APPLICATION_VERIFICATION);
    return 0;
  }

  return 1;
}